

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

bool __thiscall
Rml::Element::StartTransition
          (Element *this,Transition *transition,Property *start_value,Property *target_value)

{
  PropertyId PVar1;
  pointer pEVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pEVar6;
  iterator __position;
  bool bVar7;
  float fVar8;
  double dVar9;
  float local_9c;
  ElementAnimation local_88;
  vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_> local_48;
  
  pEVar2 = (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->animations).
       super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
       super__Vector_impl_data._M_finish;
  PVar1 = transition->id;
  uVar4 = (long)__position._M_current - (long)pEVar2;
  if (0 < (long)uVar4 >> 8) {
    uVar5 = uVar4 & 0xffffffffffffff00;
    lVar3 = ((long)uVar4 >> 8) + 1;
    pEVar6 = pEVar2 + 2;
    do {
      if (pEVar6[-2].property_id == PVar1) {
        pEVar6 = pEVar6 + -2;
        goto LAB_0021d755;
      }
      if (pEVar6[-1].property_id == PVar1) {
        pEVar6 = pEVar6 + -1;
        goto LAB_0021d755;
      }
      if (pEVar6->property_id == PVar1) goto LAB_0021d755;
      if (pEVar6[1].property_id == PVar1) {
        pEVar6 = pEVar6 + 1;
        goto LAB_0021d755;
      }
      lVar3 = lVar3 + -1;
      pEVar6 = pEVar6 + 4;
    } while (1 < lVar3);
    uVar4 = (long)__position._M_current - (long)(&pEVar2->property_id + uVar5);
    pEVar2 = (pointer)(&pEVar2->property_id + uVar5);
  }
  lVar3 = (long)uVar4 >> 6;
  if (lVar3 == 1) {
LAB_0021d735:
    pEVar6 = pEVar2;
    if (pEVar2->property_id != PVar1) {
      pEVar6 = __position._M_current;
    }
  }
  else if (lVar3 == 2) {
LAB_0021d72d:
    pEVar6 = pEVar2;
    if (pEVar2->property_id != PVar1) {
      pEVar2 = pEVar2 + 1;
      goto LAB_0021d735;
    }
  }
  else {
    if (lVar3 != 3) goto LAB_0021d765;
    pEVar6 = pEVar2;
    if (pEVar2->property_id != PVar1) {
      pEVar2 = pEVar2 + 1;
      goto LAB_0021d72d;
    }
  }
LAB_0021d755:
  bVar7 = pEVar6 != __position._M_current;
  __position._M_current = pEVar6;
  if ((bVar7) && (pEVar6->origin != Transition)) {
    return false;
  }
LAB_0021d765:
  local_9c = transition->duration;
  dVar9 = Clock::GetElapsedTime();
  dVar9 = (double)transition->delay + dVar9;
  if (__position._M_current ==
      (this->animations).
      super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ElementAnimation::ElementAnimation
              (&local_88,transition->id,Transition,start_value,this,dVar9,0.0,1,false);
    ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::
    emplace_back<Rml::ElementAnimation>(&this->animations,&local_88);
    ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_88.keys);
    __position._M_current =
         (this->animations).
         super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  else {
    fVar8 = ElementAnimation::GetInterpolationFactorAndKeys
                      (__position._M_current,(int *)0x0,(int *)0x0);
    local_9c = local_9c * (1.0 - (1.0 - fVar8) * transition->reverse_adjustment_factor);
    ElementAnimation::ElementAnimation
              (&local_88,transition->id,Transition,start_value,this,dVar9,0.0,1,false);
    *(ulong *)((long)&(__position._M_current)->duration + 1) =
         CONCAT53(local_88._8_5_,local_88.duration._1_3_);
    (__position._M_current)->property_id = local_88.property_id;
    *(int3 *)&(__position._M_current)->field_0x1 = local_88._1_3_;
    (__position._M_current)->duration =
         (float)(int)(CONCAT35(local_88.duration._1_3_,local_88._0_5_) >> 0x20);
    local_48.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ((__position._M_current)->keys).
         super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_start =
         ((__position._M_current)->keys).
         super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ((__position._M_current)->keys).
         super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ((__position._M_current)->keys).
    super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
         _M_impl.super__Vector_impl_data._M_start;
    ((__position._M_current)->keys).
    super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    ((__position._M_current)->keys).
    super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_48);
    *(undefined4 *)((long)&(__position._M_current)->current_iteration + 3) = local_88._55_4_;
    (__position._M_current)->last_update_world_time = local_88.last_update_world_time;
    (__position._M_current)->time_since_iteration_start = (float)local_88.time_since_iteration_start
    ;
    (__position._M_current)->current_iteration =
         (int)(CONCAT17(local_88.current_iteration._3_1_,local_88._48_7_) >> 0x20);
    ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_88.keys);
  }
  bVar7 = ElementAnimation::AddKey
                    (__position._M_current,local_9c,target_value,this,transition->tween,true);
  if (!bVar7) {
    ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::_M_erase
              (&this->animations,__position);
    return false;
  }
  ElementStyle::SetProperty(&this->meta->style,transition->id,start_value);
  return true;
}

Assistant:

bool Element::StartTransition(const Transition& transition, const Property& start_value, const Property& target_value)
{
	auto it = std::find_if(animations.begin(), animations.end(), [&](const ElementAnimation& el) { return el.GetPropertyId() == transition.id; });

	if (it != animations.end() && !it->IsTransition())
		return false;

	float duration = transition.duration;
	double start_time = Clock::GetElapsedTime() + (double)transition.delay;

	if (it == animations.end())
	{
		// Add transition as new animation
		animations.push_back(ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false});
		it = (animations.end() - 1);
	}
	else
	{
		// Compress the duration based on the progress of the current animation
		float f = it->GetInterpolationFactor();
		f = 1.0f - (1.0f - f) * transition.reverse_adjustment_factor;
		duration = duration * f;
		// Replace old transition
		*it = ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false};
	}

	bool result = it->AddKey(duration, target_value, *this, transition.tween, true);

	if (result)
		SetProperty(transition.id, start_value);
	else
		animations.erase(it);

	return result;
}